

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O1

void __thiscall google::protobuf::MapValueRef::DeleteData(MapValueRef *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  
  switch(this->type_) {
  case 1:
  case 3:
  case 6:
  case 8:
    puVar2 = (undefined8 *)this->data_;
    if (puVar2 != (undefined8 *)0x0) {
      uVar1 = 4;
LAB_005ce1c6:
      operator_delete(puVar2,uVar1);
      return;
    }
    break;
  case 2:
  case 4:
  case 5:
    puVar2 = (undefined8 *)this->data_;
    if (puVar2 != (undefined8 *)0x0) {
      uVar1 = 8;
      goto LAB_005ce1c6;
    }
    break;
  case 7:
    puVar2 = (undefined8 *)this->data_;
    if (puVar2 != (undefined8 *)0x0) {
      uVar1 = 1;
      goto LAB_005ce1c6;
    }
    break;
  case 9:
    puVar2 = (undefined8 *)this->data_;
    if (puVar2 != (undefined8 *)0x0) {
      if ((long *)*puVar2 != puVar2 + 2) {
        operator_delete((long *)*puVar2,puVar2[2] + 1);
      }
      uVar1 = 0x20;
      goto LAB_005ce1c6;
    }
    break;
  case 10:
    if ((long *)this->data_ != (long *)0x0) {
      (**(code **)(*this->data_ + 8))();
      return;
    }
  }
  return;
}

Assistant:

void DeleteData() {
    switch (type_) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                              \
      case google::protobuf::FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
        delete reinterpret_cast<TYPE*>(data_);                  \
        break;                                                  \
      }
      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(ENUM, int32);
      HANDLE_TYPE(MESSAGE, Message);
#undef HANDLE_TYPE
    }
  }